

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::recordPivots(HModel *this,int columnIn,int columnOut,double alpha)

{
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  value_type_conflict1 *in_XMM0_Qa;
  
  if (-1 < in_ESI) {
    *(int *)(in_RDI + 0x588) = *(int *)(in_RDI + 0x588) + 1;
  }
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)CONCAT44(in_ESI,in_EDX),(value_type *)in_XMM0_Qa);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)CONCAT44(in_ESI,in_EDX),(value_type *)in_XMM0_Qa);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_ESI,in_EDX),in_XMM0_Qa);
  return;
}

Assistant:

void HModel::recordPivots(int columnIn, int columnOut, double alpha) {
    if (columnIn >= 0) numberIteration++;
#ifdef JAJH_dev
    historyColumnIn.push_back(columnIn);
    historyColumnOut.push_back(columnOut);
    historyAlpha.push_back(alpha);
#endif
}